

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_deserialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->union_ == true) && (tstruct->is_union_ == true)) {
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_68._M_dataplus._M_p,local_68._M_string_length);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = await ",9);
    type_name_abi_cxx11_(&local_88,this,&tstruct->super_t_type,true);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".ReadAsync(iprot, ",0x12);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_68._M_dataplus._M_p,local_68._M_string_length);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = new ",7);
    type_name_abi_cxx11_(&local_88,this,&tstruct->super_t_type,true);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"();",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"await ",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".ReadAsync(iprot, ",0x12);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    if (is_union_enabled() && tstruct->is_union())
    {
        out << indent() << prefix << " = await " << type_name(tstruct) << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else
    {
        out << indent() << prefix << " = new " << type_name(tstruct) << "();" << endl
            << indent() << "await " << prefix << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
}